

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx512::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,size_t primID,BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  size_t *psVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM18 [16];
  
  fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar24 = (this->super_Points).super_Geometry.time_range.lower;
  fVar37 = (this->super_Points).super_Geometry.time_range.upper - fVar24;
  fVar27 = (time_range->lower - fVar24) / fVar37;
  fVar37 = (time_range->upper - fVar24) / fVar37;
  fVar24 = fVar1 * fVar27;
  fVar6 = fVar1 * fVar37;
  auVar21 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
  auVar30 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),10);
  auVar39 = ZEXT816(0) << 0x40;
  auVar29 = vmaxss_avx(auVar21,auVar39);
  auVar23 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
  fVar45 = auVar29._0_4_;
  fVar42 = auVar23._0_4_;
  iVar11 = -1;
  if (-1 < (int)auVar21._0_4_) {
    iVar11 = (int)auVar21._0_4_;
  }
  uVar9 = (int)fVar1 + 1U;
  if ((int)auVar30._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar9 = (int)auVar30._0_4_;
  }
  lVar10 = (long)(int)fVar45;
  pBVar4 = (this->super_Points).vertices.items;
  pcVar5 = pBVar4[lVar10].super_RawBufferView.ptr_ofs;
  lVar13 = pBVar4[lVar10].super_RawBufferView.stride * primID;
  auVar29 = *(undefined1 (*) [16])(pcVar5 + lVar13);
  fVar2 = (this->super_Points).maxRadiusScale;
  auVar35._4_4_ = fVar2;
  auVar35._0_4_ = fVar2;
  auVar35._8_4_ = fVar2;
  auVar35._12_4_ = fVar2;
  fVar7 = fVar2 * *(float *)(pcVar5 + lVar13 + 0xc);
  auVar23._4_4_ = fVar7;
  auVar23._0_4_ = fVar7;
  auVar23._8_4_ = fVar7;
  auVar23._12_4_ = fVar7;
  auVar21 = vsubps_avx(auVar29,auVar23);
  lVar13 = (long)(int)fVar42;
  pcVar5 = pBVar4[lVar13].super_RawBufferView.ptr_ofs;
  lVar15 = pBVar4[lVar13].super_RawBufferView.stride * primID;
  auVar23 = *(undefined1 (*) [16])(pcVar5 + lVar15);
  fVar2 = fVar2 * *(float *)(pcVar5 + lVar15 + 0xc);
  auVar34._0_4_ = auVar29._0_4_ + fVar7;
  auVar34._4_4_ = auVar29._4_4_ + fVar7;
  auVar34._8_4_ = auVar29._8_4_ + fVar7;
  auVar34._12_4_ = auVar29._12_4_ + fVar7;
  auVar29._4_4_ = fVar2;
  auVar29._0_4_ = fVar2;
  auVar29._8_4_ = fVar2;
  auVar29._12_4_ = fVar2;
  auVar29 = vsubps_avx(auVar23,auVar29);
  auVar30._0_4_ = auVar23._0_4_ + fVar2;
  auVar30._4_4_ = auVar23._4_4_ + fVar2;
  auVar30._8_4_ = auVar23._8_4_ + fVar2;
  auVar30._12_4_ = auVar23._12_4_ + fVar2;
  if (uVar9 - iVar11 == 1) {
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar45)),auVar39);
    fVar24 = auVar23._0_4_;
    fVar1 = 1.0 - fVar24;
    auVar38._0_4_ = fVar24 * auVar29._0_4_;
    auVar38._4_4_ = fVar24 * auVar29._4_4_;
    auVar38._8_4_ = fVar24 * auVar29._8_4_;
    auVar38._12_4_ = fVar24 * auVar29._12_4_;
    auVar36._4_4_ = fVar1;
    auVar36._0_4_ = fVar1;
    auVar36._8_4_ = fVar1;
    auVar36._12_4_ = fVar1;
    aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar38,auVar36,auVar21);
    auVar25._0_4_ = fVar24 * auVar30._0_4_;
    auVar25._4_4_ = fVar24 * auVar30._4_4_;
    auVar25._8_4_ = fVar24 * auVar30._8_4_;
    auVar25._12_4_ = fVar24 * auVar30._12_4_;
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar32;
    aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar25,auVar34,auVar36);
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar32;
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar6)),auVar39);
    fVar24 = auVar23._0_4_;
    fVar1 = 1.0 - fVar24;
    auVar33._0_4_ = auVar21._0_4_ * fVar24;
    auVar33._4_4_ = auVar21._4_4_ * fVar24;
    auVar33._8_4_ = auVar21._8_4_ * fVar24;
    auVar33._12_4_ = auVar21._12_4_ * fVar24;
    auVar28._4_4_ = fVar1;
    auVar28._0_4_ = fVar1;
    auVar28._8_4_ = fVar1;
    auVar28._12_4_ = fVar1;
    aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar29,auVar28,auVar33);
    auVar26._0_4_ = auVar34._0_4_ * fVar24;
    auVar26._4_4_ = auVar34._4_4_ * fVar24;
    auVar26._8_4_ = auVar34._8_4_ * fVar24;
    auVar26._12_4_ = auVar34._12_4_ * fVar24;
    aVar31 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar30,auVar28,auVar26);
  }
  else {
    pcVar5 = pBVar4[lVar10 + 1].super_RawBufferView.ptr_ofs;
    lVar10 = pBVar4[lVar10 + 1].super_RawBufferView.stride * primID;
    auVar23 = *(undefined1 (*) [16])(pcVar5 + lVar10);
    uVar3 = *(undefined4 *)(pcVar5 + lVar10 + 0xc);
    auVar20._4_4_ = uVar3;
    auVar20._0_4_ = uVar3;
    auVar20._8_4_ = uVar3;
    auVar20._12_4_ = uVar3;
    auVar16 = vmulps_avx512vl(auVar35,auVar20);
    auVar22 = vsubps_avx(auVar23,auVar16);
    pcVar5 = pBVar4[lVar13 + -1].super_RawBufferView.ptr_ofs;
    lVar10 = pBVar4[lVar13 + -1].super_RawBufferView.stride * primID;
    auVar20 = *(undefined1 (*) [16])(pcVar5 + lVar10);
    uVar3 = *(undefined4 *)(pcVar5 + lVar10 + 0xc);
    auVar17._4_4_ = uVar3;
    auVar17._0_4_ = uVar3;
    auVar17._8_4_ = uVar3;
    auVar17._12_4_ = uVar3;
    auVar17 = vmulps_avx512vl(auVar35,auVar17);
    auVar18 = vsubps_avx512vl(auVar20,auVar17);
    auVar17 = vaddps_avx512vl(auVar20,auVar17);
    auVar20 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar45)),auVar39);
    auVar19 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar20);
    fVar24 = auVar20._0_4_;
    auVar47._0_4_ = fVar24 * auVar22._0_4_;
    auVar47._4_4_ = fVar24 * auVar22._4_4_;
    auVar47._8_4_ = fVar24 * auVar22._8_4_;
    auVar47._12_4_ = fVar24 * auVar22._12_4_;
    auVar20 = vbroadcastss_avx512vl(auVar19);
    auVar21 = vfmadd213ps_avx512vl(auVar21,auVar20,auVar47);
    auVar19._0_4_ = fVar24 * (auVar23._0_4_ + auVar16._0_4_);
    auVar19._4_4_ = fVar24 * (auVar23._4_4_ + auVar16._4_4_);
    auVar19._8_4_ = fVar24 * (auVar23._8_4_ + auVar16._8_4_);
    auVar19._12_4_ = fVar24 * (auVar23._12_4_ + auVar16._12_4_);
    auVar22 = vfmadd213ps_avx512vl(auVar34,auVar20,auVar19);
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar6)),auVar39);
    auVar39._0_4_ = auVar23._0_4_;
    fVar24 = 1.0 - auVar39._0_4_;
    auVar39._4_4_ = auVar39._0_4_;
    auVar39._8_4_ = auVar39._0_4_;
    auVar39._12_4_ = auVar39._0_4_;
    auVar23 = vmulps_avx512vl(auVar39,auVar18);
    auVar18._4_4_ = fVar24;
    auVar18._0_4_ = fVar24;
    auVar18._8_4_ = fVar24;
    auVar18._12_4_ = fVar24;
    aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar29,auVar18,auVar23);
    auVar16._0_4_ = auVar39._0_4_ * auVar17._0_4_;
    auVar16._4_4_ = auVar39._0_4_ * auVar17._4_4_;
    auVar16._8_4_ = auVar39._0_4_ * auVar17._8_4_;
    auVar16._12_4_ = auVar39._0_4_ * auVar17._12_4_;
    aVar31 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar30,auVar18,auVar16);
    uVar12 = iVar11 + 1;
    if ((int)uVar12 < (int)uVar9) {
      psVar14 = &pBVar4[uVar12].super_RawBufferView.stride;
      auVar29 = auVar21;
      auVar23 = auVar22;
      do {
        auVar21 = vcvtsi2ss_avx512f(in_XMM18,uVar12);
        fVar40 = (auVar21._0_4_ / fVar1 - fVar27) / (fVar37 - fVar27);
        fVar6 = 1.0 - fVar40;
        auVar46._0_4_ = fVar40 * aVar32.m128[0];
        fVar24 = aVar32.m128[1];
        auVar46._4_4_ = fVar40 * fVar24;
        fVar42 = aVar32.m128[2];
        auVar46._8_4_ = fVar40 * fVar42;
        fVar2 = aVar32.m128[3];
        auVar46._12_4_ = fVar40 * fVar2;
        auVar43._4_4_ = fVar6;
        auVar43._0_4_ = fVar6;
        auVar43._8_4_ = fVar6;
        auVar43._12_4_ = fVar6;
        auVar39 = vfmadd231ps_fma(auVar46,auVar43,auVar29);
        auVar41._0_4_ = fVar40 * aVar31.m128[0];
        fVar6 = aVar31.m128[1];
        auVar41._4_4_ = fVar40 * fVar6;
        fVar45 = aVar31.m128[2];
        auVar41._8_4_ = fVar40 * fVar45;
        fVar7 = aVar31.m128[3];
        auVar41._12_4_ = fVar40 * fVar7;
        auVar34 = vfmadd231ps_fma(auVar41,auVar23,auVar43);
        auVar21 = *(undefined1 (*) [16])
                   (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * primID);
        uVar3 = *(undefined4 *)
                 (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * primID + 0xc);
        auVar8._4_4_ = uVar3;
        auVar8._0_4_ = uVar3;
        auVar8._8_4_ = uVar3;
        auVar8._12_4_ = uVar3;
        auVar20 = vmulps_avx512vl(auVar35,auVar8);
        auVar30 = vsubps_avx(auVar21,auVar20);
        auVar30 = vsubps_avx(auVar30,auVar39);
        auVar44._0_4_ = auVar21._0_4_ + auVar20._0_4_;
        auVar44._4_4_ = auVar21._4_4_ + auVar20._4_4_;
        auVar44._8_4_ = auVar21._8_4_ + auVar20._8_4_;
        auVar44._12_4_ = auVar21._12_4_ + auVar20._12_4_;
        auVar21 = vsubps_avx(auVar44,auVar34);
        auVar39 = vminps_avx(auVar30,ZEXT416(0) << 0x20);
        auVar30 = vmaxps_avx(auVar21,ZEXT416(0) << 0x20);
        auVar21._0_4_ = auVar39._0_4_ + auVar29._0_4_;
        auVar21._4_4_ = auVar39._4_4_ + auVar29._4_4_;
        auVar21._8_4_ = auVar39._8_4_ + auVar29._8_4_;
        auVar21._12_4_ = auVar39._12_4_ + auVar29._12_4_;
        aVar32._0_4_ = auVar39._0_4_ + aVar32.m128[0];
        aVar32._4_4_ = auVar39._4_4_ + fVar24;
        aVar32._8_4_ = auVar39._8_4_ + fVar42;
        aVar32._12_4_ = auVar39._12_4_ + fVar2;
        auVar22._0_4_ = auVar30._0_4_ + auVar23._0_4_;
        auVar22._4_4_ = auVar30._4_4_ + auVar23._4_4_;
        auVar22._8_4_ = auVar30._8_4_ + auVar23._8_4_;
        auVar22._12_4_ = auVar30._12_4_ + auVar23._12_4_;
        aVar31._0_4_ = auVar30._0_4_ + aVar31.m128[0];
        aVar31._4_4_ = auVar30._4_4_ + fVar6;
        aVar31._8_4_ = auVar30._8_4_ + fVar45;
        aVar31._12_4_ = auVar30._12_4_ + fVar7;
        uVar12 = uVar12 + 1;
        psVar14 = psVar14 + 7;
        auVar29 = auVar21;
        auVar23 = auVar22;
      } while (uVar9 != uVar12);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar21;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar22;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar32;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar31;
  return __return_storage_ptr__;
}

Assistant:

__forceinline LBBox3fa linearBounds(size_t primID, const BBox1f& dt) const {
      return LBBox3fa([&](size_t itime) { return bounds(primID, itime); }, dt, time_range, fnumTimeSegments);
    }